

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  LodePNGColorMode *info;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  size_t bytewidth;
  uchar *puVar8;
  uchar *out_00;
  long lVar9;
  size_t sVar10;
  uint uVar11;
  size_t __size;
  ulong uVar12;
  uint y;
  uint uVar13;
  size_t __size_00;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  size_t local_240;
  uint passh [7];
  uint passw [7];
  uint passh_1 [7];
  uint passw_1 [7];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t passstart_1 [8];
  size_t passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  info = &info_png->color;
  uVar6 = lodepng_get_bpp(info);
  if (info_png->interlace_method == 0) {
    sVar10 = (ulong)uVar6 * (ulong)w;
    __size_00 = (sVar10 + 7 >> 3) * (ulong)h;
    __size = h + __size_00;
    *outsize = __size;
    puVar8 = (uchar *)malloc(__size);
    *out = puVar8;
    if (__size != 0 && puVar8 == (uchar *)0x0) {
      return 0x53;
    }
    if ((7 < uVar6) || (uVar14 = sVar10 + 7 & 0xffffffff8, sVar10 == uVar14)) {
      uVar6 = filter(puVar8,in,w,h,info,settings);
      return uVar6;
    }
    out_00 = (uchar *)malloc(__size_00);
    if (out_00 == (uchar *)0x0) {
      uVar7 = 0x53;
    }
    else {
      addPaddingBits(out_00,in,uVar14,sVar10,h);
      uVar7 = filter(puVar8,out_00,w,h,info,settings);
    }
  }
  else {
    Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,passstart,w,h,uVar6);
    *outsize = filter_passstart[7];
    puVar8 = (uchar *)malloc(filter_passstart[7]);
    *out = puVar8;
    out_00 = (uchar *)malloc(passstart[7]);
    if ((puVar8 == (uchar *)0x0) || (passstart[7] != 0 && out_00 == (uchar *)0x0)) {
LAB_0014ea16:
      uVar7 = 0x53;
    }
    else {
      Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,passstart_1,w,h,
                          uVar6);
      if (uVar6 < 8) {
        for (lVar9 = 0; lVar9 != 7; lVar9 = lVar9 + 1) {
          uVar7 = passw_1[lVar9];
          uVar13 = passh_1[lVar9];
          for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
            for (uVar14 = 0; uVar14 != uVar7; uVar14 = uVar14 + 1) {
              uVar16 = (ulong)((ADAM7_DX[lVar9] * (int)uVar14 + ADAM7_IX[lVar9] +
                               (ADAM7_DY[lVar9] * uVar11 + ADAM7_IY[lVar9]) * w) * uVar6);
              local_240 = (ulong)((uVar11 * uVar7 + (int)uVar14) * uVar6) + passstart_1[lVar9] * 8;
              uVar15 = uVar6;
              while (bVar17 = uVar15 != 0, uVar15 = uVar15 - 1, bVar17) {
                uVar12 = uVar16 >> 3;
                bVar5 = (byte)uVar16;
                uVar16 = uVar16 + 1;
                setBitOfReversedStream(&local_240,out_00,(in[uVar12] >> (~bVar5 & 7) & 1) != 0);
              }
            }
          }
        }
      }
      else {
        uVar14 = (ulong)(uVar6 >> 3);
        for (lVar9 = 0; lVar9 != 7; lVar9 = lVar9 + 1) {
          uVar7 = passh_1[lVar9];
          for (uVar13 = 0; uVar13 != uVar7; uVar13 = uVar13 + 1) {
            uVar11 = passw_1[lVar9];
            uVar15 = uVar11 * uVar13;
            for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
              sVar10 = passstart_1[lVar9];
              uVar1 = ADAM7_DX[lVar9];
              uVar2 = ADAM7_IX[lVar9];
              uVar3 = ADAM7_DY[lVar9];
              uVar4 = ADAM7_IY[lVar9];
              for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
                out_00[uVar12 + uVar15 * uVar14 + sVar10] =
                     in[uVar12 + ((uVar3 * uVar13 + uVar4) * w + uVar1 * (int)uVar16 + uVar2) *
                                 uVar14];
              }
              uVar15 = uVar15 + 1;
            }
          }
        }
      }
      lVar9 = 0;
      do {
        if (lVar9 == 7) {
          uVar7 = 0;
          break;
        }
        if (uVar6 < 8) {
          puVar8 = (uchar *)malloc(padded_passstart[lVar9 + 1] - padded_passstart[lVar9]);
          if (puVar8 == (uchar *)0x0) goto LAB_0014ea16;
          uVar7 = passw[lVar9];
          sVar10 = (ulong)uVar7 * (ulong)uVar6;
          uVar13 = passh[lVar9];
          addPaddingBits(puVar8,out_00 + passstart[lVar9],sVar10 + 7 & 0xffffffff8,sVar10,uVar13);
          uVar7 = filter(*out + filter_passstart[lVar9],puVar8,uVar7,uVar13,info,settings);
          free(puVar8);
        }
        else {
          uVar7 = filter(*out + filter_passstart[lVar9],out_00 + padded_passstart[lVar9],
                         passw[lVar9],passh[lVar9],info,settings);
        }
        lVar9 = lVar9 + 1;
      } while (uVar7 == 0);
    }
  }
  free(out_00);
  return uVar7;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
                                    unsigned w, unsigned h,
                                    const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings) {
  /*
  This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
  *) if no Adam7: 1) add padding bits (= possible extra bits per scanline if bpp < 8) 2) filter
  *) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
  */
  size_t bpp = lodepng_get_bpp(&info_png->color);
  unsigned error = 0;
  if(info_png->interlace_method == 0) {
    /*image size plus an extra byte per scanline + possible padding bits*/
    *outsize = (size_t)h + ((size_t)h * (((size_t)w * bpp + 7u) / 8u));
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out) && (*outsize)) error = 83; /*alloc fail*/

    if(!error) {
      /*non multiple of 8 bits per scanline, padding bits needed per scanline*/
      if(bpp < 8 && (size_t)w * bpp != (((size_t)w * bpp + 7u) / 8u) * 8u) {
        unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7u) / 8u));
        if(!padded) error = 83; /*alloc fail*/
        if(!error) {
          addPaddingBits(padded, in, (((size_t)w * bpp + 7u) / 8u) * 8u, (size_t)w * bpp, h);
          error = filter(*out, padded, w, h, &info_png->color, settings);
        }
        lodepng_free(padded);
      } else {
        /*we can immediately filter into the out buffer, no other steps needed*/
        error = filter(*out, in, w, h, &info_png->color, settings);
      }
    }
  } else /*interlace_method is 1 (Adam7)*/ {
    unsigned passw[7], passh[7];
    size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned char* adam7;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, (unsigned)bpp);

    *outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out)) error = 83; /*alloc fail*/

    adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
    if(!adam7 && passstart[7]) error = 83; /*alloc fail*/

    if(!error) {
      unsigned i;

      Adam7_interlace(adam7, in, w, h, (unsigned)bpp);
      for(i = 0; i != 7; ++i) {
        if(bpp < 8) {
          unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
          if(!padded) ERROR_BREAK(83); /*alloc fail*/
          addPaddingBits(padded, &adam7[passstart[i]],
                         (((size_t)passw[i] * bpp + 7u) / 8u) * 8u, (size_t)passw[i] * bpp, passh[i]);
          error = filter(&(*out)[filter_passstart[i]], padded,
                         passw[i], passh[i], &info_png->color, settings);
          lodepng_free(padded);
        } else {
          error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
                         passw[i], passh[i], &info_png->color, settings);
        }

        if(error) break;
      }
    }

    lodepng_free(adam7);
  }

  return error;
}